

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whereami.c
# Opt level: O2

int wai_getExecutablePath(char *out,int capacity,int *dirname_length)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  char buffer [4096];
  
  bVar6 = false;
  sVar3 = 0xffffffff;
LAB_0010830f:
  do {
    do {
      if (bVar6) {
        return (int)sVar3;
      }
      pcVar2 = realpath("/proc/self/exe",buffer);
      if (pcVar2 == (char *)0x0) {
        return -1;
      }
      sVar3 = strlen(pcVar2);
      bVar6 = true;
    } while ((capacity < (int)sVar3) ||
            (memcpy(out,pcVar2,(long)(int)sVar3), dirname_length == (int *)0x0));
    pcVar2 = out + ((sVar3 & 0xffffffff) - 1);
    uVar5 = sVar3 & 0xffffffff;
    do {
      if ((int)uVar5 < 1) goto LAB_0010830f;
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + -1;
    } while (cVar1 != '/');
    *dirname_length = uVar4;
  } while( true );
}

Assistant:

WAI_FUNCSPEC
int WAI_PREFIX(getExecutablePath)(char* out, int capacity, int* dirname_length)
{
  char buffer[PATH_MAX];
  char* resolved = NULL;
  int length = -1;
  bool ok;

  for (ok = false; !ok; ok = true)
  {
    resolved = realpath(WAI_PROC_SELF_EXE, buffer);
    if (!resolved)
      break;

    length = (int)strlen(resolved);
    if (length <= capacity)
    {
      memcpy(out, resolved, length);

      if (dirname_length)
      {
        int i;

        for (i = length - 1; i >= 0; --i)
        {
          if (out[i] == '/')
          {
            *dirname_length = i;
            break;
          }
        }
      }
    }
  }

  return ok ? length : -1;
}